

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

bool __thiscall FxBinary::ResolveLR(FxBinary *this,FCompileContext *ctx,bool castnumeric)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PFloat **ppPVar3;
  PType *pPVar4;
  undefined7 in_register_00000011;
  
  pFVar1 = this->left;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx,CONCAT71(in_register_00000011,castnumeric));
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  pFVar1 = this->right;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
    this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
  }
  pFVar1 = this->left;
  if ((pFVar1 == (FxExpression *)0x0) || (this->right == (FxExpression *)0x0)) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return false;
  }
  if ((pFVar1->ValueType == (PType *)TypeBool) && (this->right->ValueType == (PType *)TypeBool)) {
    (this->super_FxExpression).ValueType = (PType *)TypeBool;
  }
  iVar2 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])();
  if ((iVar2 == 0) &&
     (iVar2 = (*(this->right->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 0)) {
    ppPVar3 = (PFloat **)&TypeSInt32;
  }
  else {
    pFVar1 = this->left;
    pPVar4 = pFVar1->ValueType;
    if ((pPVar4 != (PType *)TypeName) &&
       ((iVar2 = (**(code **)(*(long *)&pPVar4->super_DObject + 0x90))(), iVar2 == 0 ||
        (iVar2 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 1)))) {
      pFVar1 = this->right;
      pPVar4 = pFVar1->ValueType;
      if ((pPVar4 != (PType *)TypeName) &&
         ((iVar2 = (**(code **)(*(long *)&pPVar4->super_DObject + 0x90))(), iVar2 == 0 ||
          (iVar2 = (*(pFVar1->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 == 1)))) {
        ppPVar3 = &TypeFloat64;
        goto LAB_00667d75;
      }
    }
    iVar2 = (*(this->left->ValueType->super_DObject)._vptr_DObject[0x12])();
    if ((iVar2 == 3) && (pPVar4 = this->left->ValueType, pPVar4 == this->right->ValueType))
    goto LAB_00667d78;
    ppPVar3 = (PFloat **)&TypeVoid;
  }
LAB_00667d75:
  pPVar4 = (PType *)*ppPVar3;
LAB_00667d78:
  (this->super_FxExpression).ValueType = pPVar4;
  return true;
}

Assistant:

bool FxBinary::ResolveLR(FCompileContext& ctx, bool castnumeric)
{
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return false;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	if (left->ValueType->GetRegType() == REGT_INT && right->ValueType->GetRegType() == REGT_INT)
	{
		ValueType = TypeSInt32;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		ValueType = TypeFloat64;
	}
	else if (left->ValueType->GetRegType() == REGT_POINTER && left->ValueType == right->ValueType)
	{
		ValueType = left->ValueType;
	}
	else
	{
		ValueType = TypeVoid;
	}

	if (castnumeric)
	{
		// later!
	}
	return true;
}